

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

_Bool cpu_physical_memory_is_io_mips(AddressSpace *as,hwaddr phys_addr)

{
  MemoryRegion *pMVar1;
  hwaddr l;
  hwaddr phys_addr_local;
  
  l = 1;
  phys_addr_local = phys_addr;
  pMVar1 = address_space_translate(as,phys_addr,&phys_addr_local,&l,false,(MemTxAttrs)0x1);
  return (_Bool)(pMVar1->ram ^ 1);
}

Assistant:

bool cpu_physical_memory_is_io(AddressSpace *as, hwaddr phys_addr)
{
    MemoryRegion*mr;
    hwaddr l = 1;
    bool res;

    mr = address_space_translate(as,
                                 phys_addr, &phys_addr, &l, false,
                                 MEMTXATTRS_UNSPECIFIED);

    res = !memory_region_is_ram(mr);
    return res;
}